

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O3

void history_unmask_unknown(player *p)

{
  _Bool _Var1;
  long lVar2;
  size_t sVar3;
  
  sVar3 = (p->hist).next;
  if (sVar3 != 0) {
    lVar2 = sVar3 * 0x5c;
    do {
      _Var1 = flag_has_dbg((p->hist).entries[-1].type + lVar2,2,2,"h->entries[i].type",
                           "HIST_ARTIFACT_UNKNOWN");
      if (_Var1) {
        flag_off((p->hist).entries[-1].type + lVar2,2,2);
        flag_on_dbg((p->hist).entries[-1].type + lVar2,2,3,"h->entries[i].type",
                    "HIST_ARTIFACT_KNOWN");
      }
      sVar3 = sVar3 - 1;
      lVar2 = lVar2 + -0x5c;
    } while (sVar3 != 0);
  }
  return;
}

Assistant:

void history_unmask_unknown(struct player *p)
{
	struct player_history *h = &p->hist;

	size_t i = h->next;
	while (i--) {
		if (hist_has(h->entries[i].type, HIST_ARTIFACT_UNKNOWN)) {
			hist_off(h->entries[i].type, HIST_ARTIFACT_UNKNOWN);
			hist_on(h->entries[i].type, HIST_ARTIFACT_KNOWN);
		}
	}
}